

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eth_linux.c
# Opt level: O0

int csp_eth_init(char *device,char *ifname,int mtu,uint node_id,_Bool promisc,
                csp_iface_t **return_iface)

{
  __uint16_t _Var1;
  int iVar2;
  char *__dest;
  ssize_t sVar3;
  uint in_ECX;
  int in_EDX;
  uint uVar4;
  char *in_RSI;
  char *in_RDI;
  byte in_R8B;
  undefined8 *in_R9;
  sockaddr_ll my_addr;
  int sockopt;
  ifreq if_mac;
  int count;
  char exe [1024];
  eth_context_t *ctx;
  undefined4 in_stack_fffffffffffffb54;
  sockaddr local_490;
  undefined1 local_47c [4];
  char local_478 [18];
  uint local_466;
  undefined2 local_462;
  int local_44c;
  char local_448 [88];
  int local_14;
  
  __dest = (char *)calloc(1,200);
  if (__dest == (char *)0x0) {
    local_14 = -1;
  }
  else {
    strcpy(__dest,in_RSI);
    *(char **)(__dest + 0x18) = __dest;
    *(code **)(__dest + 0x78) = csp_eth_tx_frame;
    *(uint8_t **)(__dest + 0x80) = csp_eth_tx_buffer;
    *(code **)(__dest + 0x30) = csp_eth_tx;
    *(short *)(__dest + 0x10) = (short)in_ECX;
    *(char **)(__dest + 0x28) = __dest;
    *(char **)(__dest + 0x20) = __dest + 0x10;
    __dest[0x70] = in_R8B & 1;
    if (in_EDX < 0x18) {
      csp_print_func("csp_if_eth_init: mtu < 24\n");
      local_14 = -2;
    }
    else {
      _Var1 = __bswap_16(0x88b5);
      iVar2 = socket(0x11,3,(uint)_Var1);
      *(int *)(__dest + 0x98) = iVar2;
      if (iVar2 == -1) {
        perror("socket");
        sVar3 = readlink("/proc/self/exe",local_448,0x400);
        local_44c = (int)sVar3;
        if (0 < local_44c) {
          csp_print_func("Use command \'sudo setcap cap_net_raw+ep %s\'\n",local_448);
        }
        local_14 = -2;
      }
      else {
        memset(__dest + 0xa0,0,0x28);
        strncpy(__dest + 0xa0,in_RDI,0xf);
        iVar2 = ioctl(*(int *)(__dest + 0x98),0x8933,__dest + 0xa0);
        if (iVar2 < 0) {
          perror("SIOCGIFINDEX");
          local_14 = -2;
        }
        else {
          memset(local_478,0,0x28);
          strncpy(local_478,in_RDI,0xf);
          iVar2 = ioctl(*(int *)(__dest + 0x98),0x8927,local_478);
          if (iVar2 < 0) {
            perror("SIOCGIFHWADDR");
            local_14 = -2;
          }
          else {
            *(uint *)(__dest + 0x90) = local_466;
            *(undefined2 *)(__dest + 0x94) = local_462;
            uVar4 = local_466 >> 0x10 & 0xff;
            csp_print_func("INIT %s %s idx %d node %d mac %02hhx:%02hhx:%02hhx:%02hhx:%02hhx:%02hhx\n"
                           ,in_RSI,in_RDI,(ulong)*(uint *)(__dest + 0xb0),(ulong)in_ECX,
                           (ulong)(byte)local_466,local_466 >> 8 & 0xff,uVar4,local_466 >> 0x18,
                           (uint)(byte)local_462,(uint)local_462._1_1_);
            iVar2 = setsockopt(*(int *)(__dest + 0x98),1,2,local_47c,4);
            if (iVar2 == -1) {
              perror("setsockopt");
              close(*(int *)(__dest + 0x98));
              local_14 = -2;
            }
            else {
              iVar2 = setsockopt(*(int *)(__dest + 0x98),1,0x19,in_RDI,0xf);
              if (iVar2 == -1) {
                perror("SO_BINDTODEVICE");
                close(*(int *)(__dest + 0x98));
                local_14 = -2;
              }
              else {
                local_490.sa_family = 0x11;
                local_490.sa_data._0_2_ = __bswap_16(0x88b5);
                local_490.sa_data._2_4_ = *(undefined4 *)(__dest + 0xb0);
                bind(*(int *)(__dest + 0x98),&local_490,0x14);
                *(short *)(__dest + 0x72) = (short)in_EDX;
                pthread_create(&csp_eth_init::server_handle,(pthread_attr_t *)0x0,csp_eth_rx_loop,
                               __dest);
                csp_iflist_add((csp_iface_t *)CONCAT44(in_stack_fffffffffffffb54,uVar4));
                if (in_R9 != (undefined8 *)0x0) {
                  *in_R9 = __dest + 0x10;
                }
                local_14 = 0;
              }
            }
          }
        }
      }
    }
  }
  return local_14;
}

Assistant:

int csp_eth_init(const char * device, const char * ifname, int mtu, unsigned int node_id, bool promisc, csp_iface_t ** return_iface) {

	eth_context_t * ctx = calloc(1, sizeof(*ctx));
	if (ctx == NULL) {
		return CSP_ERR_NOMEM;
	}
	
	strcpy(ctx->name, ifname);
	ctx->ifdata.iface.name = ctx->name;
    ctx->ifdata.tx_func = &csp_eth_tx_frame;
    ctx->ifdata.tx_buf = (csp_eth_header_t*)&csp_eth_tx_buffer;
    ctx->ifdata.iface.nexthop = &csp_eth_tx,
	ctx->ifdata.iface.addr = node_id;
	ctx->ifdata.iface.driver_data = ctx;
    ctx->ifdata.iface.interface_data = &ctx->ifdata;
    ctx->ifdata.promisc = promisc;

    /* Ether header 14 byte, seg header 4 byte, CSP header 6 byte */
    if (mtu < 24) {
        csp_print("csp_if_eth_init: mtu < 24\n");
        return CSP_ERR_INVAL;
    }


    /**
     * TX SOCKET
     */

    /* Open RAW socket to send on */
    if ((ctx->sockfd = socket(AF_PACKET, SOCK_RAW, htobe16(CSP_ETH_TYPE_CSP))) == -1) {
        perror("socket");
        char exe[1024];
        int count = readlink("/proc/self/exe", exe, sizeof(exe));
        if (count > 0) {
            csp_print("Use command 'sudo setcap cap_net_raw+ep %s'\n", exe);
        }
        return CSP_ERR_INVAL;
    }

    /* Get the index of the interface to send on */
    memset(&ctx->if_idx, 0, sizeof(struct ifreq));
    strncpy(ctx->if_idx.ifr_name, device, IFNAMSIZ-1);
    if (ioctl(ctx->sockfd, SIOCGIFINDEX, &ctx->if_idx) < 0) {
        perror("SIOCGIFINDEX");
        return CSP_ERR_INVAL;
    }

    struct ifreq if_mac;
    /* Get the MAC address of the interface to send on */
    memset(&if_mac, 0, sizeof(struct ifreq));
    strncpy(if_mac.ifr_name, device, IFNAMSIZ-1);
    if (ioctl(ctx->sockfd, SIOCGIFHWADDR, &if_mac) < 0) {
        perror("SIOCGIFHWADDR");
        return CSP_ERR_INVAL;
    }

    memcpy(&ctx->ifdata.if_mac, if_mac.ifr_hwaddr.sa_data, sizeof(ctx->ifdata.if_mac));

    csp_print("INIT %s %s idx %d node %d mac %02hhx:%02hhx:%02hhx:%02hhx:%02hhx:%02hhx\n", 
        ifname, device, ctx->if_idx.ifr_ifindex, node_id,
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[0],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[1],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[2],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[3],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[4],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[5]);

    /* Allow the socket to be reused - incase connection is closed prematurely */
    int sockopt;
    if (setsockopt(ctx->sockfd, SOL_SOCKET, SO_REUSEADDR, &sockopt, sizeof sockopt) == -1) {
        perror("setsockopt");
        close(ctx->sockfd);
        return CSP_ERR_INVAL;
    }

    /* Bind to device */
    if (setsockopt(ctx->sockfd, SOL_SOCKET, SO_BINDTODEVICE, device, IFNAMSIZ-1) == -1)	{
        perror("SO_BINDTODEVICE");
        close(ctx->sockfd);
        return CSP_ERR_INVAL;
    }

    /* fill sockaddr_ll struct to prepare binding */
    struct sockaddr_ll my_addr;
    my_addr.sll_family = AF_PACKET;
    my_addr.sll_protocol = htobe16(CSP_ETH_TYPE_CSP);
    my_addr.sll_ifindex = ctx->if_idx.ifr_ifindex;

    /* bind socket  */
    bind(ctx->sockfd, (struct sockaddr *)&my_addr, sizeof(struct sockaddr_ll));

    ctx->ifdata.tx_mtu = mtu;

    /* Start server thread */
    static pthread_t server_handle;
    pthread_create(&server_handle, NULL, &csp_eth_rx_loop, ctx);

    /**
     * CSP INTERFACE
     */

    /* Register interface */
    csp_iflist_add(&ctx->ifdata.iface);

	if (return_iface) {
		*return_iface = &ctx->ifdata.iface;
	}

    return CSP_ERR_NONE;}